

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpack-validate.cpp
# Opt level: O0

void usage(char **argv)

{
  ostream *poVar1;
  undefined8 *in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,(char *)*in_RDI);
  poVar1 = std::operator<<(poVar1," [OPTIONS] INFILE");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "This program reads the VPack INFILE into a string and ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "validates it. Will work only for input files up to 2 GB size.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Available options are:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           " --hex                     try to turn hex-encoded input into binary vpack"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void usage(char* argv[]) {
  std::cout << "Usage: " << argv[0] << " [OPTIONS] INFILE" << std::endl;
  std::cout << "This program reads the VPack INFILE into a string and "
            << std::endl;
  std::cout << "validates it. Will work only for input files up to 2 GB size."
            << std::endl;
  std::cout << "Available options are:" << std::endl;
  std::cout << " --hex                     try to turn hex-encoded input into "
               "binary vpack"
            << std::endl;
}